

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS
ref_phys_yplus_metric
          (REF_GRID ref_grid,REF_DBL *metric,REF_DBL mach,REF_DBL re,REF_DBL temperature,
          REF_DBL target,REF_INT ldim,REF_DBL *field,REF_DICT ref_dict_bcs,
          REF_BOOL sample_viscous_length_error)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_EDGE ref_edge;
  uint uVar2;
  REF_STATUS RVar3;
  REF_BOOL RVar4;
  REF_INT *vector;
  REF_DBL *vector_00;
  REF_DBL *lengthscale;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  REF_NODE pRVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  int iVar14;
  REF_DBL *pRVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  int iVar26;
  REF_INT bc;
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_DBL logm [6];
  REF_DBL m [6];
  REF_DBL *local_1c0;
  REF_INT local_1ac;
  REF_NODE local_1a8;
  REF_DBL local_1a0;
  REF_DBL local_198;
  REF_DBL local_190;
  double local_188;
  double dStack_180;
  double local_178;
  REF_DICT local_170;
  double local_168;
  double local_160;
  undefined8 local_158;
  double local_150;
  double dStack_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  REF_DBL local_98;
  double local_90 [5];
  REF_DBL local_68 [7];
  
  pRVar8 = ref_grid->node;
  uVar2 = pRVar8->max;
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x40e,
           "ref_phys_yplus_metric","malloc hits of REF_INT negative");
    return 1;
  }
  local_1a0 = re;
  local_198 = target;
  local_190 = mach;
  local_170 = ref_dict_bcs;
  vector = (REF_INT *)malloc(uVar11 * 4);
  auVar20 = _DAT_0020e360;
  if (vector == (REF_INT *)0x0) {
    pcVar12 = "malloc hits of REF_INT NULL";
    uVar7 = 0x40e;
    goto LAB_001b1b5a;
  }
  if (uVar11 != 0) {
    lVar5 = uVar11 - 1;
    auVar18._8_4_ = (int)lVar5;
    auVar18._0_8_ = lVar5;
    auVar18._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar18 = auVar18 ^ _DAT_0020e360;
    auVar19 = _DAT_0020e340;
    auVar21 = _DAT_0020e350;
    do {
      auVar25 = auVar21 ^ auVar20;
      iVar14 = auVar18._4_4_;
      if ((bool)(~(auVar25._4_4_ == iVar14 && auVar18._0_4_ < auVar25._0_4_ ||
                  iVar14 < auVar25._4_4_) & 1)) {
        *(undefined4 *)((long)vector + lVar5) = 0;
      }
      if ((auVar25._12_4_ != auVar18._12_4_ || auVar25._8_4_ <= auVar18._8_4_) &&
          auVar25._12_4_ <= auVar18._12_4_) {
        *(undefined4 *)((long)vector + lVar5 + 4) = 0;
      }
      auVar25 = auVar19 ^ auVar20;
      iVar26 = auVar25._4_4_;
      if (iVar26 <= iVar14 && (iVar26 != iVar14 || auVar25._0_4_ <= auVar18._0_4_)) {
        *(undefined4 *)((long)vector + lVar5 + 8) = 0;
        *(undefined4 *)((long)vector + lVar5 + 0xc) = 0;
      }
      lVar6 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar6 + 4;
      lVar6 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar6 + 4;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar5);
  }
  local_1a8 = pRVar8;
  vector_00 = (REF_DBL *)malloc(uVar11 * 0x30);
  if (vector_00 == (REF_DBL *)0x0) {
    pcVar12 = "malloc new_log_metric of REF_DBL NULL";
    uVar7 = 0x40f;
    goto LAB_001b1b5a;
  }
  if (uVar11 == 0) {
    local_1c0 = (REF_DBL *)malloc(0);
    if (local_1c0 == (REF_DBL *)0x0) goto LAB_001b1b16;
    lengthscale = (REF_DBL *)malloc(0);
  }
  else {
    memset(vector_00,0,(uVar11 * 6 & 0xffffffff) << 3);
    local_1c0 = (REF_DBL *)calloc(1,uVar11 << 3);
    if (local_1c0 == (REF_DBL *)0x0) {
LAB_001b1b16:
      pcVar12 = "malloc lengthscale of REF_DBL NULL";
      uVar7 = 0x410;
      goto LAB_001b1b5a;
    }
    lengthscale = (REF_DBL *)calloc(1,uVar11 << 3);
  }
  if (lengthscale == (REF_DBL *)0x0) {
    pcVar12 = "malloc lengthscale2 of REF_DBL NULL";
    uVar7 = 0x411;
LAB_001b1b5a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar7,
           "ref_phys_yplus_metric",pcVar12);
    return 2;
  }
  uVar2 = ref_phys_yplus_lengthscale(ref_grid,local_190,local_1a0,temperature,ldim,field,local_1c0);
  if (uVar2 == 0) {
    uVar2 = ref_phys_yplus_lengthscale2
                      (ref_grid,local_190,local_1a0,temperature,ldim,field,lengthscale);
    if (uVar2 == 0) {
      if (ref_grid->twod == 0) {
        pcVar12 = "implement 3D";
        uVar2 = 6;
        uVar7 = 0x45a;
        uVar11 = 6;
        goto LAB_001b1bcc;
      }
      ref_cell = ref_grid->cell[0];
      if (0 < ref_cell->max) {
        iVar14 = 0;
        do {
          RVar3 = ref_cell_nodes(ref_cell,iVar14,(REF_INT *)&local_108);
          if (RVar3 == 0) {
            local_1ac = -1;
            uVar2 = ref_dict_value(local_170,
                                   *(REF_INT *)((long)&local_108 + (long)ref_cell->node_per * 4),
                                   &local_1ac);
            if ((uVar2 != 0) && (uVar2 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x426,"ref_phys_yplus_metric",(ulong)uVar2,"bc");
              local_1a0 = (REF_DBL)CONCAT44(local_1a0._4_4_,uVar2);
            }
            if ((uVar2 != 5) && (uVar2 != 0)) {
              return local_1a0._0_4_;
            }
            RVar4 = ref_phys_wall_distance_bc(local_1ac);
            if (RVar4 != 0) {
              uVar2 = ref_layer_interior_seg_normal(ref_grid,iVar14,&local_188);
              if (uVar2 != 0) {
                pcVar12 = "edge norm";
                uVar7 = 0x428;
                goto LAB_001b1bc9;
              }
              local_150 = local_188;
              dStack_148 = dStack_180;
              local_140 = local_178;
              lVar5 = (long)(int)local_108;
              dVar16 = (metric[lVar5 * 6 + 5] * local_178 +
                       metric[lVar5 * 6 + 2] * local_188 + dStack_180 * metric[lVar5 * 6 + 4]) *
                       local_178 +
                       (metric[lVar5 * 6 + 2] * local_178 +
                       metric[lVar5 * 6] * local_188 + dStack_180 * metric[lVar5 * 6 + 1]) *
                       local_188 +
                       (metric[lVar5 * 6 + 4] * local_178 +
                       metric[lVar5 * 6 + 1] * local_188 + metric[lVar5 * 6 + 3] * dStack_180) *
                       dStack_180;
              if (dVar16 < 0.0) {
                dVar16 = sqrt(dVar16);
              }
              else {
                dVar16 = SQRT(dVar16);
              }
              lVar5 = (long)local_108._4_4_;
              dVar17 = (metric[lVar5 * 6 + 5] * local_178 +
                       metric[lVar5 * 6 + 2] * local_188 + dStack_180 * metric[lVar5 * 6 + 4]) *
                       local_178 +
                       (metric[lVar5 * 6 + 2] * local_178 +
                       metric[lVar5 * 6] * local_188 + metric[lVar5 * 6 + 1] * dStack_180) *
                       local_188 +
                       (metric[lVar5 * 6 + 4] * local_178 +
                       metric[lVar5 * 6 + 1] * local_188 + metric[lVar5 * 6 + 3] * dStack_180) *
                       dStack_180;
              if (dVar17 < 0.0) {
                dVar17 = sqrt(dVar17);
              }
              else {
                dVar17 = SQRT(dVar17);
              }
              lVar6 = (long)(int)local_108;
              lVar5 = (long)local_108._4_4_;
              dVar22 = (local_1c0[lVar5] + local_1c0[lVar6]) * 0.5;
              dVar23 = (lengthscale[lVar5] + lengthscale[lVar6]) * 0.5 - dVar22;
              if (dVar23 <= -dVar23) {
                dVar23 = -dVar23;
              }
              dVar23 = dVar23 / dVar22 + -0.1;
              if (dVar23 <= 0.0) {
                dVar23 = 0.0;
              }
              dVar23 = dVar23 / 0.1;
              if (1.0 <= dVar23) {
                dVar23 = 1.0;
              }
              dVar24 = (dVar22 * local_198) / 0.866025403784439;
              if (sample_viscous_length_error != 0) {
                dVar24 = dVar23 * (1.0 / ((dVar16 + dVar17) * 0.5)) +
                         ((1.0 - dVar23) * local_198 * dVar22) / 0.866025403784439;
              }
              local_168 = 1.0 / (dVar24 * dVar24);
              pRVar15 = ref_grid->node->real;
              printf("x %.4f l1 %.3e l2 %.3e diff %.4f s %.2f %.2f t %.3e m %.3e h %.3e\n",
                     (pRVar15[lVar6 * 0xf] + pRVar15[lVar5 * 0xf]) * 0.5);
              local_120 = 0;
              uStack_118 = 0;
              local_110 = 0x3ff0000000000000;
              local_158 = 0x3ff0000000000000;
              local_130 = local_150 - local_140 * 0.0;
              local_138 = local_140 * 0.0 - dStack_148;
              local_128 = dStack_148 * 0.0 + local_150 * -0.0;
              lVar5 = (long)(int)local_108;
              dVar16 = (metric[lVar5 * 6 + 5] * local_128 +
                       local_138 * metric[lVar5 * 6 + 2] + local_130 * metric[lVar5 * 6 + 4]) *
                       local_128 +
                       (metric[lVar5 * 6 + 2] * local_128 +
                       metric[lVar5 * 6] * local_138 + local_130 * metric[lVar5 * 6 + 1]) *
                       local_138 +
                       (metric[lVar5 * 6 + 4] * local_128 +
                       metric[lVar5 * 6 + 1] * local_138 + metric[lVar5 * 6 + 3] * local_130) *
                       local_130;
              if (dVar16 < 0.0) {
                dVar16 = sqrt(dVar16);
              }
              else {
                dVar16 = SQRT(dVar16);
              }
              lVar5 = (long)local_108._4_4_;
              dVar17 = (metric[lVar5 * 6 + 5] * local_128 +
                       metric[lVar5 * 6 + 2] * local_138 + local_130 * metric[lVar5 * 6 + 4]) *
                       local_128 +
                       (metric[lVar5 * 6 + 2] * local_128 +
                       metric[lVar5 * 6] * local_138 + metric[lVar5 * 6 + 1] * local_130) *
                       local_138 +
                       (metric[lVar5 * 6 + 4] * local_128 +
                       metric[lVar5 * 6 + 1] * local_138 + metric[lVar5 * 6 + 3] * local_130) *
                       local_130;
              if (dVar17 < 0.0) {
                dVar17 = sqrt(dVar17);
              }
              else {
                dVar17 = SQRT(dVar17);
              }
              dVar16 = 1.0 / ((dVar16 + dVar17) * 0.5);
              local_160 = 1.0 / (dVar16 * dVar16);
              uVar2 = ref_matrix_form_m(&local_168,local_68);
              if (uVar2 != 0) {
                pcVar12 = "form";
                uVar7 = 0x44e;
                goto LAB_001b1bc9;
              }
              uVar2 = ref_matrix_log_m(local_68,&local_98);
              if (uVar2 != 0) {
                pcVar12 = "form";
                uVar7 = 0x44f;
                goto LAB_001b1bc9;
              }
              lVar5 = (long)(int)local_108;
              lVar6 = 0;
              do {
                dVar17 = (vector_00 + lVar5 * 6 + lVar6)[1];
                dVar16 = local_90[lVar6];
                vector_00[lVar5 * 6 + lVar6] = vector_00[lVar5 * 6 + lVar6] + local_90[lVar6 + -1];
                (vector_00 + lVar5 * 6 + lVar6)[1] = dVar17 + dVar16;
                lVar6 = lVar6 + 2;
              } while (lVar6 != 6);
              vector[lVar5] = vector[lVar5] + 1;
              lVar5 = (long)local_108._4_4_;
              lVar6 = 0;
              do {
                dVar17 = (vector_00 + lVar5 * 6 + lVar6)[1];
                dVar16 = local_90[lVar6];
                vector_00[lVar5 * 6 + lVar6] = vector_00[lVar5 * 6 + lVar6] + local_90[lVar6 + -1];
                (vector_00 + lVar5 * 6 + lVar6)[1] = dVar17 + dVar16;
                lVar6 = lVar6 + 2;
              } while (lVar6 != 6);
              vector[lVar5] = vector[lVar5] + 1;
            }
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < ref_cell->max);
      }
      pRVar8 = local_1a8;
      uVar2 = ref_node_ghost_dbl(local_1a8,vector_00,6);
      if (uVar2 == 0) {
        uVar2 = ref_node_ghost_int(pRVar8,vector,1);
        if (uVar2 == 0) {
          iVar14 = pRVar8->max;
          if (0 < iVar14) {
            lVar5 = 0;
            pRVar15 = vector_00;
            do {
              if ((-1 < pRVar8->global[lVar5]) && (0 < vector[lVar5])) {
                auVar20._0_8_ = (double)vector[lVar5];
                auVar20._8_8_ = auVar20._0_8_;
                lVar6 = 0;
                do {
                  auVar19 = divpd(*(undefined1 (*) [16])(pRVar15 + lVar6),auVar20);
                  *(undefined1 (*) [16])(pRVar15 + lVar6) = auVar19;
                  lVar6 = lVar6 + 2;
                } while (lVar6 != 6);
                vector[lVar5] = -1;
                uVar2 = ref_matrix_exp_m(vector_00 + lVar5 * 6,metric + lVar5 * 6);
                if (uVar2 != 0) {
                  pcVar12 = "form";
                  uVar7 = 0x467;
                  goto LAB_001b1bc9;
                }
                iVar14 = local_1a8->max;
                pRVar8 = local_1a8;
              }
              lVar5 = lVar5 + 1;
              pRVar15 = pRVar15 + 6;
            } while (lVar5 < iVar14);
          }
          uVar2 = ref_edge_create((REF_EDGE *)&local_108,ref_grid);
          if (uVar2 == 0) {
            ref_edge = (REF_EDGE)CONCAT44(local_108._4_4_,(int)local_108);
            if (0 < ref_edge->n) {
              pRVar1 = ref_edge->e2n;
              lVar5 = 0;
              do {
                iVar14 = pRVar1[lVar5 * 2];
                lVar9 = (long)iVar14;
                iVar26 = pRVar1[lVar5 * 2 + 1];
                lVar6 = (long)iVar26;
                iVar10 = vector[lVar9];
                if ((-1 < iVar10) && (vector[lVar6] == -1)) {
                  lVar13 = 0;
                  do {
                    vector_00[lVar9 * 6 + lVar13] =
                         vector_00[iVar26 * 6 + lVar13] + vector_00[lVar9 * 6 + lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 6);
                  iVar10 = iVar10 + 1;
                  vector[lVar9] = iVar10;
                }
                iVar26 = vector[lVar6];
                if ((-1 < iVar26) && (iVar10 == -1)) {
                  lVar9 = 0;
                  do {
                    vector_00[lVar6 * 6 + lVar9] =
                         vector_00[iVar14 * 6 + lVar9] + vector_00[lVar6 * 6 + lVar9];
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 6);
                  vector[lVar6] = iVar26 + 1;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < ref_edge->n);
            }
            ref_edge_free(ref_edge);
            pRVar8 = local_1a8;
            uVar2 = ref_node_ghost_dbl(local_1a8,vector_00,6);
            if (uVar2 == 0) {
              uVar2 = ref_node_ghost_int(pRVar8,vector,1);
              if (uVar2 == 0) {
                iVar14 = pRVar8->max;
                if (0 < iVar14) {
                  lVar5 = 0;
                  pRVar15 = vector_00;
                  do {
                    if ((-1 < pRVar8->global[lVar5]) && (0 < vector[lVar5])) {
                      auVar25._0_8_ = (double)vector[lVar5];
                      auVar25._8_8_ = auVar25._0_8_;
                      lVar6 = 0;
                      do {
                        auVar20 = divpd(*(undefined1 (*) [16])(pRVar15 + lVar6),auVar25);
                        *(undefined1 (*) [16])(pRVar15 + lVar6) = auVar20;
                        lVar6 = lVar6 + 2;
                      } while (lVar6 != 6);
                      vector[lVar5] = -2;
                      uVar2 = ref_matrix_exp_m(vector_00 + lVar5 * 6,metric + lVar5 * 6);
                      if (uVar2 != 0) {
                        pcVar12 = "form";
                        uVar7 = 0x48c;
                        goto LAB_001b1bc9;
                      }
                      iVar14 = local_1a8->max;
                      pRVar8 = local_1a8;
                    }
                    lVar5 = lVar5 + 1;
                    pRVar15 = pRVar15 + 6;
                  } while (lVar5 < iVar14);
                }
                uVar2 = ref_node_ghost_dbl(pRVar8,metric,6);
                if (uVar2 == 0) {
                  free(lengthscale);
                  free(local_1c0);
                  free(vector_00);
                  free(vector);
                  return 0;
                }
                pcVar12 = "ghost metric";
                uVar7 = 0x490;
              }
              else {
                pcVar12 = "ghost hits";
                uVar7 = 0x483;
              }
            }
            else {
              pcVar12 = "ghost metric";
              uVar7 = 0x482;
            }
          }
          else {
            pcVar12 = "orig edges";
            uVar7 = 0x46e;
          }
        }
        else {
          pcVar12 = "ghost hits";
          uVar7 = 0x45e;
        }
      }
      else {
        pcVar12 = "ghost metric";
        uVar7 = 0x45d;
      }
    }
    else {
      pcVar12 = "length scale";
      uVar7 = 0x417;
    }
  }
  else {
    pcVar12 = "length scale";
    uVar7 = 0x414;
  }
LAB_001b1bc9:
  uVar11 = (ulong)uVar2;
LAB_001b1bcc:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar7,
         "ref_phys_yplus_metric",uVar11,pcVar12);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_metric(REF_GRID ref_grid, REF_DBL *metric,
                                         REF_DBL mach, REF_DBL re,
                                         REF_DBL temperature, REF_DBL target,
                                         REF_INT ldim, REF_DBL *field,
                                         REF_DICT ref_dict_bcs,
                                         REF_BOOL sample_viscous_length_error) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *lengthscale, *lengthscale2, *new_log_metric;
  REF_INT *hits;
  REF_INT node, i;
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale2, ref_node_max(ref_node), REF_DBL, 0.0);
  RSS(ref_phys_yplus_lengthscale(ref_grid, mach, re, temperature, ldim, field,
                                 lengthscale),
      "length scale");
  RSS(ref_phys_yplus_lengthscale2(ref_grid, mach, re, temperature, ldim, field,
                                  lengthscale2),
      "length scale");
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_INT bc;
    REF_INT edg, edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL edg_norm[3], mh, h0, h1, ratio;
    REF_DBL d[12], m[6], logm[6];
    REF_DBL err1 = 0.10, err2 = 0.20;
    REF_DBL l1, l2, s1, s2, diff;
    REF_DBL equilateral_altitude =
        0.866025403784439; /* sqrt(3.0)/2 altitude of equalateral triangle */
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, edg_nodes[ref_cell_id_index(edg_cell)],
                         &bc),
          REF_NOT_FOUND, "bc");
      if (!ref_phys_wall_distance_bc(bc)) continue;
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      ref_matrix_vec(d, 0, 0) = edg_norm[0];
      ref_matrix_vec(d, 1, 0) = edg_norm[1];
      ref_matrix_vec(d, 2, 0) = edg_norm[2];
      ratio =
          0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]), edg_norm) +
                 ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]), edg_norm));
      mh = 1.0 / ratio;
      l1 = 0.5 * (lengthscale[edg_nodes[0]] + lengthscale[edg_nodes[1]]);
      l2 = 0.5 * (lengthscale2[edg_nodes[0]] + lengthscale2[edg_nodes[1]]);
      diff = ABS(l2 - l1) / l1;
      s2 = MIN(MAX(diff - err1, 0.0) / (err2 - err1), 1.0);
      s1 = 1.0 - s2;
      h0 = (s1 * target * l1 / equilateral_altitude + s2 * mh);
      if (!sample_viscous_length_error) {
        h0 = target * l1 / equilateral_altitude;
      }
      ref_matrix_eig(d, 0) = 1.0 / (h0 * h0);

      printf(
          "x %.4f l1 %.3e l2 %.3e diff %.4f s %.2f %.2f t %.3e m %.3e h %.3e\n",
          0.5 * (ref_node_xyz(ref_grid_node(ref_grid), 0, edg_nodes[0]) +
                 ref_node_xyz(ref_grid_node(ref_grid), 0, edg_nodes[1])),
          l1, l2, diff, s1, s2, target * l1 / equilateral_altitude, mh, h0);

      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_eig(d, 2) = 1.0;

      ref_math_cross_product(ref_matrix_vec_ptr(d, 2), ref_matrix_vec_ptr(d, 0),
                             ref_matrix_vec_ptr(d, 1));
      ratio = 0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]),
                                            ref_matrix_vec_ptr(d, 1)) +
                     ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]),
                                            ref_matrix_vec_ptr(d, 1)));
      h1 = 1.0 / ratio;
      ref_matrix_eig(d, 1) = 1.0 / (h1 * h1);
      RSS(ref_matrix_form_m(d, m), "form");
      RSS(ref_matrix_log_m(m, logm), "form");
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[0]] += logm[i];
      }
      hits[edg_nodes[0]] += 1;
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[1]] += logm[i];
      }
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(lengthscale2);
  ref_free(lengthscale);
  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}